

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_astFunctionApplicationNode_t **applicationNode;
  ulong uVar1;
  sysbvm_astFunctionApplicationNode_t *psVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *message;
  sysbvm_tuple_t sVar7;
  uint uVar8;
  ulong uVar9;
  anon_struct_48_6_34a7a802 gcFrame;
  ulong local_a8;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  ulong local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_tuple_t *local_40;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  local_40 = &local_98;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 6;
  sysbvm_stackFrame_pushRecord(&local_58);
  uVar4 = *(ulong *)(*arguments + 0xf8);
  if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
    uVar4 = (long)uVar4 >> 4;
  }
  else {
    uVar4 = *(ulong *)(uVar4 + 0x10);
  }
  applicationNode = (sysbvm_astFunctionApplicationNode_t **)(arguments + 1);
  uVar8 = (uint)uVar4 & 0x600;
  local_60 = (ulong)uVar8;
  uVar5 = *(ulong *)(*arguments + 0x100);
  if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
    sVar7 = (sysbvm_tuple_t)(*(uint *)(uVar5 + 0xc) >> 3);
  }
  else {
    sVar7 = 0;
  }
  uVar5 = (*applicationNode)->arguments;
  if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
    local_a8 = (ulong)(*(uint *)(uVar5 + 0xc) >> 3);
  }
  else {
    local_a8 = 0;
  }
  if (((uVar4 & 2) != 0) && (sVar7 == 0)) {
    sysbvm_error("Variadic applications require at least a single argument.");
  }
  uVar5 = sVar7 - (((uint)uVar4 & 2) >> 1);
  if (uVar8 == 0x600) {
    if (sVar7 == 0) {
      sysbvm_error("Memoized template requires at least a single argument.");
    }
    sVar7 = sVar7 - 1;
    uVar5 = uVar5 - 1;
  }
  if (((uVar4 & 2) == 0) || (uVar5 <= local_a8)) {
    if (((uVar4 & 2) != 0) || (local_a8 == sVar7)) {
      local_88 = sysbvm_array_create(context,sVar7);
      if (uVar5 != 0) {
        uVar9 = 0;
        do {
          uVar1 = *(ulong *)(*arguments + 0x100);
          if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
            sStack_80 = *(sysbvm_tuple_t *)(uVar1 + (ulong)(uVar8 == 0x600) * 8 + 0x10 + uVar9 * 8);
          }
          else {
            sStack_80 = 0;
          }
          uVar1 = (*applicationNode)->arguments;
          if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
            local_98 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar9 * 8);
          }
          else {
            local_98 = 0;
          }
          sStack_90 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                                (context,local_98,sStack_80,arguments[2]);
          if ((local_88 & 0xf) == 0 && local_88 != 0) {
            *(sysbvm_tuple_t *)(local_88 + 0x10 + uVar9 * 8) = sStack_90;
          }
          uVar9 = uVar9 + 1;
        } while (uVar5 != uVar9);
      }
      uVar9 = local_60;
      if ((uVar4 & 2) != 0) {
        local_78 = sysbvm_array_create(context,local_a8 - uVar5);
        psVar2 = *applicationNode;
        if (uVar5 < local_a8) {
          lVar3 = 0;
          do {
            uVar4 = psVar2->arguments;
            if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
              uVar6 = *(undefined8 *)(uVar4 + uVar5 * 8 + 0x10 + lVar3 * 8);
            }
            else {
              uVar6 = 0;
            }
            if ((local_78 & 0xf) == 0 && local_78 != 0) {
              *(undefined8 *)(local_78 + 0x10 + lVar3 * 8) = uVar6;
            }
            lVar3 = lVar3 + 1;
          } while (local_a8 - uVar5 != lVar3);
        }
        sStack_70 = sysbvm_astMakeArrayNode_create(context,(psVar2->super).sourcePosition,local_78);
        sStack_70 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                              (context,sStack_70,(context->roots).arrayType,arguments[2]);
        if ((local_88 & 0xf) == 0 && local_88 != 0) {
          *(sysbvm_tuple_t *)(local_88 + 0x10 + uVar5 * 8) = sStack_70;
        }
      }
      psVar2 = *applicationNode;
      uVar4 = psVar2->applicationFlags;
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar4 = (long)uVar4 >> 4;
      }
      else {
        uVar4 = *(ulong *)(uVar4 + 0x10);
      }
      psVar2->applicationFlags = ((int)uVar9 != 0x600 | uVar4) << 4 | 0x2b;
      psVar2->arguments = local_88;
      (psVar2->super).analyzedType = *(sysbvm_tuple_t *)(*arguments + 0x108);
      sysbvm_stackFrame_popRecord(&local_58);
      sVar7 = sysbvm_astFunctionApplicationNode_optimizePureApplication(context,applicationNode);
      return sVar7;
    }
    message = "Expected number of arguments is mismatching.";
  }
  else {
    message = "Missing required arguments.";
  }
  sysbvm_error(message);
}

Assistant:

static sysbvm_tuple_t sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_simpleFunctionType_t **simpleFunctionType = (sysbvm_simpleFunctionType_t**)&arguments[0];
    sysbvm_astFunctionApplicationNode_t **functionApplicationNode = (sysbvm_astFunctionApplicationNode_t**)&arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    struct {
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        sysbvm_tuple_t expectedArgumentType;
        sysbvm_tuple_t variadicArguments;
        sysbvm_tuple_t variadicArgumentsNode;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_bitflags_t flags = sysbvm_tuple_bitflags_decode((*simpleFunctionType)->super.functionFlags);
    bool isVariadic = (flags & SYSBVM_FUNCTION_FLAGS_VARIADIC) != 0;
    bool isMemoizedTemplate = (flags & SYSBVM_FUNCTION_FLAGS_MEMOIZED_TEMPLATE) == SYSBVM_FUNCTION_FLAGS_MEMOIZED_TEMPLATE;

    size_t typeArgumentCount = sysbvm_array_getSize((*simpleFunctionType)->argumentTypes);
    size_t expectedArgumentCount = typeArgumentCount;
    size_t applicationArgumentCount = sysbvm_array_getSize((*functionApplicationNode)->arguments);
    size_t startingArgumentIndex = isMemoizedTemplate ? 1 : 0;
    if(isVariadic && typeArgumentCount == 0)
        sysbvm_error("Variadic applications require at least a single argument.");

    size_t directApplicationArgumentCount = isVariadic ? typeArgumentCount - 1 : typeArgumentCount;
    if(isMemoizedTemplate)
    {
        if(expectedArgumentCount == 0)
            sysbvm_error("Memoized template requires at least a single argument.");
        --expectedArgumentCount;
        --directApplicationArgumentCount;
    }

    if(isVariadic && applicationArgumentCount < directApplicationArgumentCount)
        sysbvm_error("Missing required arguments.");
    else if(!isVariadic && applicationArgumentCount != expectedArgumentCount)
        sysbvm_error("Expected number of arguments is mismatching.");

    gcFrame.analyzedArguments = sysbvm_array_create(context, expectedArgumentCount);
    for(size_t i = 0; i < directApplicationArgumentCount; ++i)
    {
        gcFrame.expectedArgumentType = sysbvm_array_at((*simpleFunctionType)->argumentTypes, startingArgumentIndex + i);
        gcFrame.argumentNode = sysbvm_array_at((*functionApplicationNode)->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.argumentNode, gcFrame.expectedArgumentType, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    // Analyze the variadic arguments.
    if(isVariadic)
    {
        gcFrame.variadicArguments = sysbvm_array_create(context, applicationArgumentCount - directApplicationArgumentCount);
        for(size_t i = directApplicationArgumentCount; i < applicationArgumentCount; ++i)
            sysbvm_array_atPut(gcFrame.variadicArguments, i - directApplicationArgumentCount, sysbvm_array_at((*functionApplicationNode)->arguments, i));

        gcFrame.variadicArgumentsNode = sysbvm_astMakeArrayNode_create(context, (*functionApplicationNode)->super.sourcePosition, gcFrame.variadicArguments);
        gcFrame.variadicArgumentsNode = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.variadicArgumentsNode, context->roots.arrayType, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, directApplicationArgumentCount, gcFrame.variadicArgumentsNode);
    }

    (*functionApplicationNode)->applicationFlags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode((*functionApplicationNode)->applicationFlags)
        | (isMemoizedTemplate ? 0 : SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK)
        | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);
    (*functionApplicationNode)->arguments = gcFrame.analyzedArguments;
    (*functionApplicationNode)->super.analyzedType = (*simpleFunctionType)->resultType;

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_astFunctionApplicationNode_optimizePureApplication(context, functionApplicationNode);
}